

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExporter.cpp
# Opt level: O1

bool __thiscall
iDynTree::ModelExporter::exportModelToString
          (ModelExporter *this,string *modelString,string *filetype)

{
  _Head_base<0UL,_iDynTree::ModelExporter::Pimpl_*,_false> model;
  long lVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  stringstream error_msg;
  long *local_230;
  long local_220 [2];
  undefined1 local_210 [40];
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  iVar3 = std::__cxx11::string::compare((char *)filetype);
  if (iVar3 == 0) {
    model._M_head_impl =
         (this->m_pimpl)._M_t.
         super___uniq_ptr_impl<iDynTree::ModelExporter::Pimpl,_std::default_delete<iDynTree::ModelExporter::Pimpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_iDynTree::ModelExporter::Pimpl_*,_std::default_delete<iDynTree::ModelExporter::Pimpl>_>
         .super__Head_base<0UL,_iDynTree::ModelExporter::Pimpl_*,_false>._M_head_impl;
    local_210._0_8_ = local_210 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_210,*(long *)&(model._M_head_impl)->m_options,
               *(long *)((long)&(model._M_head_impl)->m_options + 8) +
               *(long *)&(model._M_head_impl)->m_options);
    local_210[0x20] = *(Model *)((long)&(model._M_head_impl)->m_options + 0x20);
    lVar1 = *(long *)((long)&(model._M_head_impl)->m_options + 0x28);
    local_1e8._M_p = (pointer)&local_1d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1e8,lVar1,
               *(long *)((long)&(model._M_head_impl)->m_options + 0x30) + lVar1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_1c8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&(model._M_head_impl)->m_options + 0x48));
    bVar2 = URDFStringFromModel(&(model._M_head_impl)->m_model,modelString,
                                (ModelExporterOptions *)local_210);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_p != &local_1d8) {
      operator_delete(local_1e8._M_p,local_1d8._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
    }
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Filetype ",9);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a0,(filetype->_M_dataplus)._M_p,filetype->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," not supported. Only urdf format is currently supported.",0x38);
    std::__cxx11::stringbuf::str();
    iDynTree::reportError("ModelExporter","exportModelToString",(char *)local_230);
    if (local_230 != local_220) {
      operator_delete(local_230,local_220[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b0);
    std::ios_base::~ios_base(local_130);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ModelExporter::exportModelToString(std::string & modelString, const std::string filetype)
{
    if (filetype != "urdf") {
        std::stringstream error_msg;
        error_msg << "Filetype " << filetype << " not supported. Only urdf format is currently supported.";
        reportError("ModelExporter", "exportModelToString", error_msg.str().c_str());
        return false;
    }

    return URDFStringFromModel(m_pimpl->m_model, modelString, m_pimpl->m_options);
}